

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O2

bool __thiscall
Assimp::Ogre::OgreImporter::ReadPass
          (OgreImporter *this,string *passName,stringstream *ss,aiMaterial *material)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  Logger *pLVar4;
  istream *piVar5;
  char *pKey;
  stringstream *psVar6;
  float b;
  float g;
  float r;
  string partAmbient;
  aiColor3D color;
  string linePart;
  string partEmissive;
  string partSpecular;
  string partDiffuse;
  char *local_208 [4];
  string partTextureUnit;
  string local_1c8;
  string textureUnitName;
  
  linePart._M_dataplus._M_p = (pointer)&linePart.field_2;
  linePart._M_string_length = 0;
  linePart.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)ss,(string *)&linePart);
  bVar1 = std::operator!=(&linePart,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          partBlockStart_abi_cxx11_);
  if (bVar1) {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[55]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &textureUnitName,
               (char (*) [55])"Invalid material: Pass block start missing near index ");
    std::istream::tellg();
    std::ostream::_M_insert<long>((long)&textureUnitName);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,partAmbient._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&partAmbient);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&textureUnitName);
  }
  else {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[9]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &textureUnitName,(char (*) [9])"  pass \'");
    std::operator<<((ostream *)&textureUnitName,(string *)passName);
    std::operator<<((ostream *)&textureUnitName,"\'");
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar4,partAmbient._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&partAmbient);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&textureUnitName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&partAmbient,"ambient",(allocator<char> *)&textureUnitName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&partDiffuse,"diffuse",(allocator<char> *)&textureUnitName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&partSpecular,"specular",(allocator<char> *)&textureUnitName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&partEmissive,"emissive",(allocator<char> *)&textureUnitName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&partTextureUnit,"texture_unit",(allocator<char> *)&textureUnitName);
LAB_004483b7:
    bVar2 = std::operator!=(&linePart,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            partBlockEnd_abi_cxx11_);
    if (bVar2) {
      std::operator>>((istream *)ss,(string *)&linePart);
      _Var3 = std::operator==(&linePart,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              partComment_abi_cxx11_);
      if (_Var3) {
        SkipLine(&local_1c8,ss);
        std::__cxx11::string::~string((string *)&local_1c8);
        goto LAB_004483b7;
      }
      _Var3 = std::operator==(&linePart,&partAmbient);
      if (_Var3) {
LAB_00448455:
        piVar5 = std::istream::_M_extract<float>((float *)ss);
        piVar5 = std::istream::_M_extract<float>((float *)piVar5);
        std::istream::_M_extract<float>((float *)piVar5);
        pLVar4 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[4]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &textureUnitName,(char (*) [4])0x5bcc86);
        std::operator<<((ostream *)&textureUnitName,(string *)&linePart);
        std::operator<<((ostream *)&textureUnitName," ");
        std::ostream::operator<<(&textureUnitName,r);
        std::operator<<((ostream *)&textureUnitName," ");
        std::ostream::operator<<(&textureUnitName,g);
        std::operator<<((ostream *)&textureUnitName," ");
        std::ostream::operator<<(&textureUnitName,b);
        std::__cxx11::stringbuf::str();
        Logger::debug(pLVar4,local_208[0]);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&textureUnitName);
        _Var3 = std::operator==(&linePart,&partAmbient);
        pKey = "$clr.ambient";
        if (!_Var3) {
          _Var3 = std::operator==(&linePart,&partDiffuse);
          pKey = "$clr.diffuse";
          if (!_Var3) {
            _Var3 = std::operator==(&linePart,&partSpecular);
            pKey = "$clr.specular";
            if (!_Var3) {
              _Var3 = std::operator==(&linePart,&partEmissive);
              pKey = "$clr.emissive";
              if (!_Var3) goto LAB_004483b7;
            }
          }
        }
        aiMaterial::AddProperty(material,&color,1,pKey,0,0);
        goto LAB_004483b7;
      }
      _Var3 = std::operator==(&linePart,&partDiffuse);
      if (_Var3) goto LAB_00448455;
      _Var3 = std::operator==(&linePart,&partSpecular);
      if (_Var3) goto LAB_00448455;
      _Var3 = std::operator==(&linePart,&partEmissive);
      if (_Var3) goto LAB_00448455;
      _Var3 = std::operator==(&linePart,&partTextureUnit);
      if (_Var3) {
        psVar6 = ss;
        SkipLine(&textureUnitName,ss);
        Trim(&textureUnitName,SUB81(psVar6,0));
        ReadTextureUnit(this,&textureUnitName,ss,material);
        std::__cxx11::string::~string((string *)&textureUnitName);
      }
      goto LAB_004483b7;
    }
    std::__cxx11::string::~string((string *)&partTextureUnit);
    std::__cxx11::string::~string((string *)&partEmissive);
    std::__cxx11::string::~string((string *)&partSpecular);
    std::__cxx11::string::~string((string *)&partDiffuse);
    std::__cxx11::string::~string((string *)&partAmbient);
  }
  std::__cxx11::string::~string((string *)&linePart);
  return !bVar1;
}

Assistant:

bool OgreImporter::ReadPass(const std::string &passName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Pass block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F("  pass '", passName, "'");

    const string partAmbient     = "ambient";
    const string partDiffuse     = "diffuse";
    const string partSpecular    = "specular";
    const string partEmissive    = "emissive";
    const string partTextureUnit = "texture_unit";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        // Colors
        /// @todo Support alpha via aiColor4D.
        if (linePart == partAmbient || linePart == partDiffuse || linePart == partSpecular || linePart == partEmissive)
        {
            float r, g, b;
            ss >> r >> g >> b;
            const aiColor3D color(r, g, b);

            ASSIMP_LOG_DEBUG_F( "   ", linePart, " ", r, " ", g, " ", b);

            if (linePart == partAmbient)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_AMBIENT);
            }
            else if (linePart == partDiffuse)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_DIFFUSE);
            }
            else if (linePart == partSpecular)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_SPECULAR);
            }
            else if (linePart == partEmissive)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_EMISSIVE);
            }
        }
        else if (linePart == partTextureUnit)
        {
            string textureUnitName = SkipLine(ss);
            ReadTextureUnit(Trim(textureUnitName), ss, material);
        }
    }
    return true;
}